

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O1

int main(int argc,char **argv)

{
  char **ppcVar1;
  bool bVar2;
  double dVar3;
  _Bool _Var4;
  byte bVar5;
  uint16_t uVar6;
  uint uVar7;
  uint block_size;
  uint uVar8;
  int iVar9;
  aom_codec_err_t aVar10;
  undefined4 extraout_var;
  aom_image_t *paVar11;
  FILE *__stream;
  uint8_t *flat_blocks;
  FILE *__stream_00;
  FILE *__s;
  ulong uVar12;
  long lVar13;
  aom_img_fmt_t aVar14;
  long lVar15;
  uchar *puVar16;
  long lVar17;
  double *pdVar18;
  double *pdVar19;
  ulong uVar20;
  int c;
  aom_img_fmt_t fmt;
  uchar *puVar21;
  size_t size;
  ulong uVar22;
  char *pcVar23;
  int xi;
  ulong uVar24;
  long lVar25;
  char **argv_00;
  long lVar26;
  bool bVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  aom_noise_model_params_t params;
  int local_9d0;
  ulong local_9c8;
  double *local_9b8;
  double *local_9b0;
  aom_rational local_9a0;
  ulong local_980;
  ulong local_970;
  int local_968;
  double *local_960;
  ulong local_948;
  ulong local_938;
  long local_930;
  int strides [3];
  aom_film_grain_table_t grain_table;
  int local_8d8 [2];
  undefined4 local_8d0;
  uchar *local_8c8;
  uchar *puStack_8c0;
  uchar *local_8b8;
  uchar *local_8a8;
  uchar *puStack_8a0;
  uchar *local_898;
  aom_image_t raw;
  aom_flat_block_finder_t block_finder;
  aom_image_t denoised;
  aom_noise_model_t noise_model;
  aom_film_grain_t grain;
  aom_internal_error_info error_info;
  
  exec_name = *argv;
  if (argv[1] == (char *)0x0) {
    local_9b0 = (double *)0x0;
    aVar14 = AOM_IMG_FMT_I420;
    block_size = 0x20;
    uVar8 = 8;
    local_930 = 10000000;
    local_9d0 = 1;
    local_938 = 0x19;
    bVar27 = false;
    local_960 = (double *)0x0;
    local_9b8 = (double *)0x0;
    pdVar18 = (double *)0x0;
    local_9c8 = 0;
    uVar20 = 0;
  }
  else {
    argv_00 = argv + 1;
    local_9b0 = (double *)0x0;
    aVar14 = AOM_IMG_FMT_I420;
    block_size = 0x20;
    uVar8 = 8;
    local_9d0 = 1;
    local_9a0.num = 0x19;
    local_9a0.den = 0;
    local_970 = 1;
    local_968 = 1;
    local_960 = (double *)0x0;
    local_9b8 = (double *)0x0;
    local_9c8 = 0;
    uVar20 = 0;
    pdVar19 = (double *)0x0;
    do {
      iVar9 = arg_match((arg *)&noise_model,&help,argv_00);
      if (iVar9 != 0) {
        fwrite("\nOptions:\n",10,1,_stdout);
LAB_00120446:
        arg_show_usage((FILE *)_stdout,(arg_def **)parse_args_main_args);
        exit(0);
      }
      iVar9 = arg_match((arg *)&noise_model,&width_arg,argv_00);
      pdVar18 = pdVar19;
      if (iVar9 == 0) {
        iVar9 = arg_match((arg *)&noise_model,&height_arg,argv_00);
        if (iVar9 == 0) {
          iVar9 = arg_match((arg *)&noise_model,&input_arg,argv_00);
          pdVar18 = noise_model.combined_state[0].eqns.A;
          if (iVar9 == 0) {
            iVar9 = arg_match((arg *)&noise_model,&input_denoised_arg,argv_00);
            if (iVar9 == 0) {
              iVar9 = arg_match((arg *)&noise_model,&output_grain_table_arg,argv_00);
              if (iVar9 == 0) {
                iVar9 = arg_match((arg *)&noise_model,&block_size_arg,argv_00);
                if (iVar9 == 0) {
                  iVar9 = arg_match((arg *)&noise_model,&bit_depth_arg,argv_00);
                  if (iVar9 == 0) {
                    iVar9 = arg_match((arg *)&noise_model,&flat_block_finder_arg,argv_00);
                    if (iVar9 == 0) {
                      iVar9 = arg_match((arg *)&noise_model,&fps_arg,argv_00);
                      if (iVar9 == 0) {
                        iVar9 = arg_match((arg *)&noise_model,&use_i420,argv_00);
                        if (iVar9 == 0) {
                          iVar9 = arg_match((arg *)&noise_model,&use_i422,argv_00);
                          if (iVar9 == 0) {
                            iVar9 = arg_match((arg *)&noise_model,&use_i444,argv_00);
                            if (iVar9 == 0) {
                              iVar9 = arg_match((arg *)&noise_model,&skip_frames_arg,argv_00);
                              if (iVar9 == 0) {
                                iVar9 = arg_match((arg *)&noise_model,&debug_file_arg,argv_00);
                                if (iVar9 == 0) {
                                  fprintf(_stdout,"Unknown arg: %s\n\nUsage:\n",*argv_00);
                                  goto LAB_00120446;
                                }
                                local_9b0 = noise_model.combined_state[0].eqns.A;
                                pdVar18 = pdVar19;
                              }
                              else {
                                local_9d0 = atoi((char *)noise_model.combined_state[0].eqns.A);
                                pdVar18 = pdVar19;
                              }
                            }
                            else {
                              aVar14 = AOM_IMG_FMT_I444;
                              pdVar18 = pdVar19;
                            }
                          }
                          else {
                            aVar14 = AOM_IMG_FMT_I422;
                            pdVar18 = pdVar19;
                          }
                        }
                        else {
                          aVar14 = AOM_IMG_FMT_I420;
                          pdVar18 = pdVar19;
                        }
                      }
                      else {
                        local_9a0 = arg_parse_rational((arg *)&noise_model);
                        local_970 = (ulong)local_9a0 >> 0x20;
                        pdVar18 = pdVar19;
                      }
                    }
                    else {
                      local_968 = atoi((char *)noise_model.combined_state[0].eqns.A);
                      pdVar18 = pdVar19;
                    }
                  }
                  else {
                    uVar8 = atoi((char *)noise_model.combined_state[0].eqns.A);
                    pdVar18 = pdVar19;
                  }
                }
                else {
                  block_size = atoi((char *)noise_model.combined_state[0].eqns.A);
                  pdVar18 = pdVar19;
                }
              }
              else {
                local_960 = noise_model.combined_state[0].eqns.A;
                pdVar18 = pdVar19;
              }
            }
            else {
              local_9b8 = noise_model.combined_state[0].eqns.A;
              pdVar18 = pdVar19;
            }
          }
        }
        else {
          iVar9 = atoi((char *)noise_model.combined_state[0].eqns.A);
          local_9c8 = CONCAT44(extraout_var,iVar9);
        }
      }
      else {
        uVar7 = atoi((char *)noise_model.combined_state[0].eqns.A);
        uVar20 = (ulong)uVar7;
      }
      ppcVar1 = argv_00 + 1;
      argv_00 = argv_00 + 1;
      pdVar19 = pdVar18;
    } while (*ppcVar1 != (char *)0x0);
    bVar27 = local_968 == 0;
    local_930 = (long)(int)local_970 * 10000000;
    local_938 = (ulong)local_9a0.num;
  }
  fmt = aVar14 | 0x800;
  if ((int)uVar8 < 9) {
    fmt = aVar14;
  }
  uVar7 = (uint)uVar20;
  if (((((int)uVar7 < 1) || ((int)(uint)local_9c8 < 1)) || ((uVar20 & 1) != 0)) ||
     ((local_9c8 & 1) != 0)) {
    die("Invalid frame size: %dx%d",uVar20,local_9c8);
  }
  paVar11 = aom_img_alloc(&raw,fmt,uVar7,(uint)local_9c8,1);
  if ((paVar11 == (aom_image_t *)0x0) ||
     (paVar11 = aom_img_alloc(&denoised,fmt,uVar7,(uint)local_9c8,1), paVar11 == (aom_image_t *)0x0)
     ) {
    pcVar23 = "Failed to allocate image.";
  }
  else {
    __stream = fopen64((char *)pdVar18,"rb");
    if (__stream == (FILE *)0x0) {
      pcVar23 = "Failed to open input file: %s";
LAB_00120482:
      die(pcVar23,pdVar18);
    }
    bVar2 = 8 < (int)uVar8;
    fprintf(_stderr,"Bit depth: %d  stride:%d\n",(ulong)uVar8,(ulong)(uint)raw.stride[0]);
    aom_flat_block_finder_init(&block_finder,block_size,uVar8,(uint)bVar2);
    size = (size_t)(((int)((uint)local_9c8 + block_size + -1) / (int)block_size) *
                   ((int)(block_size + uVar7 + -1) / (int)block_size));
    flat_blocks = (uint8_t *)aom_malloc(size);
    if (flat_blocks == (uint8_t *)0x0) {
      pcVar23 = "Failed to allocate block data.";
    }
    else {
      params.use_highbd._0_1_ = 8 < (int)uVar8;
      params.bit_depth = uVar8;
      params.use_highbd._1_3_ = 0;
      params.shape = '\x01';
      params._1_3_ = 0;
      params.lag = 3;
      aom_noise_model_init(&noise_model,params);
      if (local_9b8 == (double *)0x0) {
        pcVar23 = "--input-denoised file must be specified";
      }
      else {
        __stream_00 = fopen64((char *)local_9b8,"rb");
        if (__stream_00 == (FILE *)0x0) {
          pcVar23 = "Unable to open input_denoised: %s";
          pdVar18 = local_9b8;
          goto LAB_00120482;
        }
        if (local_9b0 == (double *)0x0) {
          __s = (FILE *)0x0;
        }
        else {
          __s = fopen64((char *)local_9b0,"w");
        }
        grain_table.head = (aom_film_grain_table_entry_t *)0x0;
        grain_table.tail = (aom_film_grain_table_entry_t *)0x0;
        _Var4 = aom_img_read(&raw,(FILE *)__stream);
        if (_Var4) {
          dVar3 = (double)(int)(block_size * block_size);
          uVar6 = 0x1cdf;
          uVar20 = 0;
          local_980 = 0;
          do {
            _Var4 = aom_img_read(&denoised,(FILE *)__stream_00);
            if (!_Var4) {
              pcVar23 = "Unable to read input denoised file";
              goto LAB_00120493;
            }
            if ((int)((long)((ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | uVar20 & 0xffffffff) %
                     (long)local_9d0) == 0) {
              memset(flat_blocks,1,size);
              if (!bVar27) {
                memset(flat_blocks,0,size);
                uVar8 = aom_flat_block_finder_run
                                  (&block_finder,raw.planes[0],uVar7,(uint)local_9c8,uVar7,
                                   flat_blocks);
                fprintf(_stdout,"Num flat blocks %d\n",(ulong)uVar8);
              }
              local_8a8 = raw.planes[0];
              puStack_8a0 = raw.planes[1];
              local_898 = raw.planes[2];
              local_8c8 = denoised.planes[0];
              puStack_8c0 = denoised.planes[1];
              local_8b8 = denoised.planes[2];
              strides[0] = raw.stride[0] >> bVar2;
              strides[1] = raw.stride[1] >> bVar2;
              strides[2] = raw.stride[2] >> bVar2;
              local_8d8[0] = raw.x_chroma_shift;
              local_8d8[1] = raw.y_chroma_shift;
              local_8d0 = 0;
              fwrite("Updating noise model...\n",0x18,1,_stdout);
              bVar5 = aom_noise_model_update
                                (&noise_model,&local_8a8,&local_8c8,uVar7,(uint)local_9c8,strides,
                                 local_8d8,flat_blocks,block_size);
              if (bVar5 == 3) {
                uVar12 = (local_930 * uVar20) / local_938;
                fprintf(_stdout,
                        "Noise type is different, updating parameters for time [ %ld, %ld)\n",
                        local_980,uVar12);
                aom_noise_model_get_grain_parameters(&noise_model,&grain);
                grain.random_seed = uVar6;
                aom_film_grain_table_append(&grain_table,local_980,uVar12,&grain);
                aom_noise_model_save_latest(&noise_model);
                uVar6 = 0;
                local_980 = uVar12;
              }
              if (__s != (FILE *)0x0) {
                fwrite("figure(3); clf;\n",0x10,1,__s);
                fwrite("figure(2); clf;\n",0x10,1,__s);
                fwrite("figure(1); clf;\n",0x10,1,__s);
                uVar12 = 0;
                do {
                  fprintf(__s,"noise_strength_%d = [\n",uVar12 & 0xffffffff);
                  if (0 < noise_model.combined_state[uVar12].strength_solver.eqns.n) {
                    lVar26 = 0;
                    do {
                      fprintf(__s,"%lf ",
                              SUB84(noise_model.combined_state[uVar12].strength_solver.eqns.x
                                    [lVar26],0));
                      lVar26 = lVar26 + 1;
                    } while (lVar26 < noise_model.combined_state[uVar12].strength_solver.eqns.n);
                  }
                  fwrite("];\n",3,1,__s);
                  fprintf(__s,"plot(noise_strength_%d); hold on;\n",uVar12 & 0xffffffff);
                  uVar12 = uVar12 + 1;
                } while (uVar12 != 3);
                fwrite("legend(\'Y\', \'cb\', \'cr\');\n",0x19,1,__s);
                fwrite("title(\'Noise strength function\');\n",0x22,1,__s);
                aom_noise_model_get_grain_parameters(&noise_model,&grain);
                grain.apply_grain = 1;
                grain.random_seed = 0x1cdf;
                grain.bit_depth = raw.bit_depth;
                aom_img_alloc((aom_image_t *)&error_info,raw.fmt,raw.w,raw.h,1);
                iVar9 = av1_add_film_grain(&grain,&denoised,(aom_image_t *)&error_info);
                uVar8 = raw.w;
                if (iVar9 == 0) {
                  uVar12 = (ulong)(raw.h + (block_size - 1)) / (ulong)block_size;
                  fwrite("x = [",5,1,__s);
                  if (0 < (int)uVar12) {
                    iVar9 = 0;
                    uVar8 = (uVar8 + (block_size - 1)) / block_size;
                    local_948 = 0;
                    do {
                      if (0 < (int)uVar8) {
                        lVar25 = 0;
                        lVar26 = 0;
                        do {
                          if ((int)block_size < 1) {
                            dVar28 = 0.0;
                            dVar32 = 0.0;
                            dVar33 = 0.0;
                            dVar29 = 0.0;
                            dVar31 = 0.0;
                          }
                          else {
                            lVar13 = (long)raw.stride[0];
                            lVar15 = iVar9 * lVar13 + lVar25;
                            lVar17 = error_info.detail._56_8_ + lVar15;
                            puVar21 = denoised.planes[0] + lVar15;
                            puVar16 = raw.planes[0] + lVar15;
                            dVar31 = 0.0;
                            uVar22 = 0;
                            dVar29 = 0.0;
                            dVar33 = 0.0;
                            dVar32 = 0.0;
                            dVar28 = 0.0;
                            do {
                              uVar24 = 0;
                              do {
                                dVar30 = (double)(int)((uint)puVar16[uVar24] - (uint)puVar21[uVar24]
                                                      );
                                dVar28 = dVar28 + dVar30;
                                dVar29 = dVar29 + dVar30 * dVar30;
                                dVar31 = dVar31 + (double)puVar16[uVar24];
                                dVar30 = (double)(int)((uint)*(byte *)(lVar17 + uVar24) -
                                                      (uint)puVar21[uVar24]);
                                dVar33 = dVar33 + dVar30;
                                dVar32 = dVar32 + dVar30 * dVar30;
                                uVar24 = uVar24 + 1;
                              } while (block_size != uVar24);
                              uVar22 = uVar22 + 1;
                              lVar17 = lVar17 + lVar13;
                              puVar21 = puVar21 + lVar13;
                              puVar16 = puVar16 + lVar13;
                            } while (uVar22 != block_size);
                          }
                          dVar29 = dVar29 / dVar3 - (dVar28 / dVar3) * (dVar28 / dVar3);
                          if (dVar29 < 0.0) {
                            dVar29 = sqrt(dVar29);
                          }
                          else {
                            dVar29 = SQRT(dVar29);
                          }
                          dVar28 = dVar32 / dVar3 - (dVar33 / dVar3) * (dVar33 / dVar3);
                          if (dVar28 < 0.0) {
                            dVar28 = sqrt(dVar28);
                          }
                          else {
                            dVar28 = SQRT(dVar28);
                          }
                          fprintf(__s,"%d %3.2lf %3.2lf %3.2lf  ",SUB84(dVar31 / dVar3,0),dVar29,
                                  dVar28,(ulong)flat_blocks[lVar26 + local_948 * (long)(int)uVar8]);
                          lVar26 = lVar26 + 1;
                          lVar25 = lVar25 + (int)block_size;
                        } while (lVar26 < (int)uVar8);
                      }
                      fputc(10,__s);
                      local_948 = local_948 + 1;
                      iVar9 = iVar9 + block_size;
                    } while (local_948 < uVar12);
                  }
                  fwrite("];\n",3,1,__s);
                  if ((raw.fmt & 0x800) == AOM_IMG_FMT_NONE) {
                    fwrite("figure(2); clf;\n",0x10,1,__s);
                    fwrite("scatter(x(:, 2:4:end), x(:, 3:4:end), \'r\'); hold on;\n",0x35,1,__s);
                    fwrite("scatter(x(:, 2:4:end), x(:, 4:4:end), \'b\');\n",0x2c,1,__s);
                    fwrite("plot(linspace(0, 255, length(noise_strength_0)), noise_strength_0, \'b\');\n"
                           ,0x49,1,__s);
                    fwrite("title(\'Scatter plot of intensity vs noise strength\');\n",0x36,1,__s);
                    fwrite("legend(\'Actual\', \'Estimated\', \'Estimated strength\');\n",0x35,1,__s
                          );
                    fwrite("figure(3); clf;\n",0x10,1,__s);
                    fwrite("scatter(x(:, 3:4:end), x(:, 4:4:end), \'k\');\n",0x2c,1,__s);
                    fwrite("title(\'Actual vs Estimated\');\n",0x1e,1,__s);
                    fwrite("pause(3);\n",10,1,__s);
                  }
                  else {
                    main_cold_2();
                  }
                }
                else {
                  main_cold_1();
                }
                aom_img_free((aom_image_t *)&error_info);
                fflush(__s);
              }
              fprintf(_stdout,"Done noise model update, status = %d\n",(ulong)bVar5);
            }
            uVar20 = uVar20 + 1;
            _Var4 = aom_img_read(&raw,(FILE *)__stream);
          } while (_Var4);
        }
        else {
          uVar6 = 0x1cdf;
          local_980 = 0;
        }
        aom_noise_model_get_grain_parameters(&noise_model,&grain);
        grain.random_seed = uVar6;
        aom_film_grain_table_append(&grain_table,local_980,0x7fffffffffffffff,&grain);
        if ((local_960 == (double *)0x0) ||
           (aVar10 = aom_film_grain_table_write(&grain_table,(char *)local_960,&error_info),
           aVar10 == AOM_CODEC_OK)) {
          aom_film_grain_table_free(&grain_table);
          fclose(__stream);
          fclose(__stream_00);
          if (__s != (FILE *)0x0) {
            fclose(__s);
          }
          aom_img_free(&raw);
          aom_img_free(&denoised);
          return 0;
        }
        pcVar23 = "Unable to write output film grain table";
      }
    }
  }
LAB_00120493:
  die(pcVar23);
}

Assistant:

int main(int argc, char *argv[]) {
  noise_model_args_t args = { 0,  0, { 25, 1 }, 0, 0, 0,   AOM_IMG_FMT_I420,
                              32, 8, 1,         0, 1, NULL };
  aom_image_t raw, denoised;
  FILE *infile = NULL;
  AvxVideoInfo info;

  memset(&info, 0, sizeof(info));

  (void)argc;
  exec_name = argv[0];
  parse_args(&args, argv + 1);

  info.frame_width = args.width;
  info.frame_height = args.height;
  info.time_base.numerator = args.fps.den;
  info.time_base.denominator = args.fps.num;

  if (info.frame_width <= 0 || info.frame_height <= 0 ||
      (info.frame_width % 2) != 0 || (info.frame_height % 2) != 0) {
    die("Invalid frame size: %dx%d", info.frame_width, info.frame_height);
  }
  if (!aom_img_alloc(&raw, args.img_fmt, info.frame_width, info.frame_height,
                     1)) {
    die("Failed to allocate image.");
  }
  if (!aom_img_alloc(&denoised, args.img_fmt, info.frame_width,
                     info.frame_height, 1)) {
    die("Failed to allocate image.");
  }
  infile = fopen(args.input, "rb");
  if (!infile) {
    die("Failed to open input file: %s", args.input);
  }
  fprintf(stderr, "Bit depth: %d  stride:%d\n", args.bit_depth, raw.stride[0]);

  const int high_bd = args.bit_depth > 8;
  const int block_size = args.block_size;
  aom_flat_block_finder_t block_finder;
  aom_flat_block_finder_init(&block_finder, block_size, args.bit_depth,
                             high_bd);

  const int num_blocks_w = (info.frame_width + block_size - 1) / block_size;
  const int num_blocks_h = (info.frame_height + block_size - 1) / block_size;
  uint8_t *flat_blocks = (uint8_t *)aom_malloc(num_blocks_w * num_blocks_h);
  if (!flat_blocks) die("Failed to allocate block data.");
  // Sets the random seed on the first entry in the output table
  int16_t random_seed = 7391;
  aom_noise_model_t noise_model;
  aom_noise_model_params_t params = { AOM_NOISE_SHAPE_SQUARE, 3, args.bit_depth,
                                      high_bd };
  aom_noise_model_init(&noise_model, params);

  FILE *denoised_file = 0;
  if (args.input_denoised) {
    denoised_file = fopen(args.input_denoised, "rb");
    if (!denoised_file)
      die("Unable to open input_denoised: %s", args.input_denoised);
  } else {
    die("--input-denoised file must be specified");
  }
  FILE *debug_file = 0;
  if (args.debug_file) {
    debug_file = fopen(args.debug_file, "w");
  }
  aom_film_grain_table_t grain_table = { 0, 0 };

  int64_t prev_timestamp = 0;
  int frame_count = 0;
  while (aom_img_read(&raw, infile)) {
    if (args.input_denoised) {
      if (!aom_img_read(&denoised, denoised_file)) {
        die("Unable to read input denoised file");
      }
    }
    if (frame_count % args.skip_frames == 0) {
      int num_flat_blocks = num_blocks_w * num_blocks_h;
      memset(flat_blocks, 1, num_flat_blocks);
      if (args.run_flat_block_finder) {
        memset(flat_blocks, 0, num_flat_blocks);
        num_flat_blocks = aom_flat_block_finder_run(
            &block_finder, raw.planes[0], info.frame_width, info.frame_height,
            info.frame_width, flat_blocks);
        fprintf(stdout, "Num flat blocks %d\n", num_flat_blocks);
      }

      const uint8_t *planes[3] = { raw.planes[0], raw.planes[1],
                                   raw.planes[2] };
      uint8_t *denoised_planes[3] = { denoised.planes[0], denoised.planes[1],
                                      denoised.planes[2] };
      int strides[3] = { raw.stride[0] >> high_bd, raw.stride[1] >> high_bd,
                         raw.stride[2] >> high_bd };
      int chroma_sub[3] = { raw.x_chroma_shift, raw.y_chroma_shift, 0 };

      fprintf(stdout, "Updating noise model...\n");
      aom_noise_status_t status = aom_noise_model_update(
          &noise_model, (const uint8_t *const *)planes,
          (const uint8_t *const *)denoised_planes, info.frame_width,
          info.frame_height, strides, chroma_sub, flat_blocks, block_size);

      int64_t cur_timestamp =
          frame_count * 10000000ULL * args.fps.den / args.fps.num;
      if (status == AOM_NOISE_STATUS_DIFFERENT_NOISE_TYPE) {
        fprintf(stdout,
                "Noise type is different, updating parameters for time "
                "[ %" PRId64 ", %" PRId64 ")\n",
                prev_timestamp, cur_timestamp);
        aom_film_grain_t grain;
        aom_noise_model_get_grain_parameters(&noise_model, &grain);
        grain.random_seed = random_seed;
        random_seed = 0;
        aom_film_grain_table_append(&grain_table, prev_timestamp, cur_timestamp,
                                    &grain);
        aom_noise_model_save_latest(&noise_model);
        prev_timestamp = cur_timestamp;
      }
      if (debug_file) {
        print_debug_info(debug_file, &raw, &denoised, flat_blocks, block_size,
                         &noise_model);
      }
      fprintf(stdout, "Done noise model update, status = %d\n", status);
    }
    frame_count++;
  }

  aom_film_grain_t grain;
  aom_noise_model_get_grain_parameters(&noise_model, &grain);
  grain.random_seed = random_seed;
  aom_film_grain_table_append(&grain_table, prev_timestamp, INT64_MAX, &grain);
  if (args.output_grain_table) {
    struct aom_internal_error_info error_info;
    if (AOM_CODEC_OK != aom_film_grain_table_write(&grain_table,
                                                   args.output_grain_table,
                                                   &error_info)) {
      die("Unable to write output film grain table");
    }
  }
  aom_film_grain_table_free(&grain_table);

  if (infile) fclose(infile);
  if (denoised_file) fclose(denoised_file);
  if (debug_file) fclose(debug_file);
  aom_img_free(&raw);
  aom_img_free(&denoised);

  return EXIT_SUCCESS;
}